

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O3

timestamp_t
duckdb::DateTrunc::UnaryFunction<duckdb::date_t,duckdb::timestamp_t,duckdb::DateTrunc::HourOperator>
          (date_t input)

{
  bool bVar1;
  timestamp_t tVar2;
  undefined1 auVar3 [12];
  timestamp_t result;
  timestamp_t local_40;
  string local_38;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(input);
  if (bVar1) {
    tVar2.value = duckdb::Timestamp::FromDatetime(input,(dtime_t)0x0);
    return (timestamp_t)tVar2.value;
  }
  bVar1 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(input,&local_40,false);
  if (bVar1) {
    return (timestamp_t)local_40.value;
  }
  auVar3 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
            (&local_38,(duckdb *)(ulong)(uint)input.days,(date_t)auVar3._8_4_);
  duckdb::InvalidInputException::InvalidInputException(auVar3._0_8_,(string *)&local_38);
  __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}